

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGeoElement.h.h
# Opt level: O0

void __thiscall
TPZGeoElement<pzgeom::TPZGeoTetrahedra,_pzrefine::TPZRefTetrahedra>::TPZGeoElement
          (TPZGeoElement<pzgeom::TPZGeoTetrahedra,_pzrefine::TPZRefTetrahedra> *this,void **vtt,
          TPZGeoMesh *DestMesh,
          TPZGeoElement<pzgeom::TPZGeoTetrahedra,_pzrefine::TPZRefTetrahedra> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  bool bVar1;
  long in_RCX;
  long *in_RSI;
  long *in_RDI;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *in_R9;
  int n;
  int i;
  TPZGeoElRefLess<pzgeom::TPZGeoTetrahedra> *in_stack_00000078;
  TPZGeoMesh *in_stack_00000080;
  void **in_stack_00000088;
  TPZGeoElRefLess<pzgeom::TPZGeoTetrahedra> *in_stack_00000090;
  size_t in_stack_000003a8;
  char *in_stack_000003b0;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  *in_stack_ffffffffffffff88;
  _Self local_58 [3];
  _Self local_40;
  int iVar2;
  int iVar3;
  
  TPZGeoElRefLess<pzgeom::TPZGeoTetrahedra>::TPZGeoElRefLess
            (in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078,
             (map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)this
             ,(map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)vtt
            );
  *in_RDI = *in_RSI;
  *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x60)) = in_RSI[5];
  iVar2 = 6;
  for (iVar3 = 0; iVar3 < iVar2; iVar3 = iVar3 + 1) {
    if (*(long *)(in_RCX + 0x1d0 + (long)iVar3 * 8) == -1) {
      in_RDI[(long)iVar3 + 0x3a] = -1;
    }
    else {
      local_40._M_node =
           (_Base_ptr)
           std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
           find(in_stack_ffffffffffffff88,(key_type_conflict1 *)0x1b0bb3c);
      local_58[0]._M_node =
           (_Base_ptr)
           std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::end
                     (in_stack_ffffffffffffff88);
      bVar1 = std::operator==(&local_40,local_58);
      if (bVar1) {
        pzinternal::DebugStopImpl(in_stack_000003b0,in_stack_000003a8);
      }
      in_stack_ffffffffffffff88 =
           (map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
           std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
           operator[](in_R9,(key_type_conflict1 *)CONCAT44(iVar3,iVar2));
      in_RDI[(long)iVar3 + 0x3a] = *(long *)&(in_stack_ffffffffffffff88->_M_t)._M_impl;
    }
  }
  return;
}

Assistant:

TPZGeoElement<TGeo,TRef>::TPZGeoElement(TPZGeoMesh &DestMesh,
										const TPZGeoElement &cp,
										std::map<int64_t,int64_t> &gl2lcNdMap,
										std::map<int64_t,int64_t> &gl2lcElMap):
TPZRegisterClassId(&TPZGeoElement::ClassId),
TPZGeoElRefLess<TGeo>(DestMesh, cp, gl2lcNdMap, gl2lcElMap)
{
	int i, n = TRef::NSubEl;
	for(i = 0; i < n; i++)
	{
		if (cp.fSubEl[i] == -1)
		{
			this->fSubEl[i]=-1;
			continue;
		}
		if (gl2lcElMap.find(cp.fSubEl[i]) == gl2lcElMap.end())
		{
#ifdef PZ_LOG
            TPZLogger logger("pz.mesh.tpzgeoelement");

            if (logger.isDebugEnabled()) {
              std::stringstream sout;
              sout << "ERROR in - " << __PRETTY_FUNCTION__
                   << " subelement index is not in map from original to "
                      "clone indexes! Son index = "
                   << fSubEl[i];
              LOGPZ_ERROR(logger, sout.str().c_str());
            }
#endif
            DebugStop();
        }
		this->fSubEl[i] = gl2lcElMap[cp.fSubEl[i]];
	}
}